

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O0

void __thiscall
YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::proxy
          (proxy *this,iterator_value *x)

{
  iterator_value *in_RDI;
  iterator_value *unaff_retaddr;
  
  iterator_value::iterator_value(unaff_retaddr,in_RDI);
  return;
}

Assistant:

explicit proxy(const V& x) : m_ref(x) {}